

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O2

void __thiscall shared_ptr_compare_ptr_Test::TestBody(shared_ptr_compare_ptr_Test *this)

{
  long lVar1;
  Struct *pSVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  bool bVar4;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult gtest_ar_26;
  Struct *pZ;
  shared_ptr<Struct> zPtr;
  Struct *pX;
  shared_ptr<Struct> yPtr;
  shared_ptr<Struct> xPtr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = (Struct *)operator_new(4);
  pSVar2->mVal = 0x7b;
  Struct::_mNbInstances = Struct::_mNbInstances + 1;
  shared_ptr<Struct>::shared_ptr(&xPtr,pSVar2);
  zPtr.super_shared_ptr_base.pn.pn._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
            ((internal *)&yPtr,"true","xPtr",(bool *)&zPtr,&xPtr);
  if ((char)yPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&zPtr);
    if (yPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)yPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x134,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26,(Message *)&zPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&zPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&yPtr.px);
  zPtr.super_shared_ptr_base.pn.pn._0_1_ = 1;
  if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = *(long *)xPtr.super_shared_ptr_base.pn.pn == 1;
  }
  gtest_ar_26.success_ = bVar4;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&yPtr,"true","xPtr.unique()",(bool *)&zPtr,&gtest_ar_26.success_);
  if ((char)yPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&zPtr);
    if (yPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)yPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x135,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26,(Message *)&zPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&zPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&yPtr.px);
  gtest_ar_26._0_4_ = 1;
  if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    zPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  }
  else {
    zPtr.super_shared_ptr_base.pn.pn = *(shared_ptr_count *)xPtr.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&yPtr,"1","xPtr.use_count()",(int *)&gtest_ar_26,(long *)&zPtr);
  if ((char)yPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&zPtr);
    if (yPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)yPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x136,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26,(Message *)&zPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&zPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&yPtr.px);
  zPtr.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  gtest_ar_26._0_8_ = xPtr.px;
  testing::internal::CmpHelperNE<void*,Struct*>
            ((internal *)&yPtr,"(void*)__null","xPtr.get()",(void **)&zPtr,(Struct **)&gtest_ar_26);
  if ((char)yPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&zPtr);
    if (yPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)yPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x137,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26,(Message *)&zPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&zPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&yPtr.px);
  zPtr.super_shared_ptr_base.pn.pn._0_4_ = 0x7b;
  pSVar2 = shared_ptr<Struct>::operator->(&xPtr);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&yPtr,"123","xPtr->mVal",(int *)&zPtr,&pSVar2->mVal);
  if ((char)yPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&zPtr);
    if (yPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)yPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x138,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26,(Message *)&zPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&zPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&yPtr.px);
  zPtr.super_shared_ptr_base.pn.pn._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&yPtr,"1","Struct::_mNbInstances",(int *)&zPtr,&Struct::_mNbInstances);
  if ((char)yPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&zPtr);
    if (yPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)yPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x139,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26,(Message *)&zPtr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&zPtr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&yPtr.px);
  pX = xPtr.px;
  pSVar2 = (Struct *)operator_new(4);
  pSVar2->mVal = 0xea;
  Struct::_mNbInstances = Struct::_mNbInstances + 1;
  shared_ptr<Struct>::shared_ptr(&yPtr,pSVar2);
  gtest_ar_26.success_ = true;
  testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
            ((internal *)&zPtr,"true","xPtr",&gtest_ar_26.success_,&xPtr);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x13f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  gtest_ar_26.success_ = true;
  if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = *(long *)xPtr.super_shared_ptr_base.pn.pn == 1;
  }
  pZ = (Struct *)CONCAT71(pZ._1_7_,bVar4);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&zPtr,"true","xPtr.unique()",&gtest_ar_26.success_,(bool *)&pZ);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x140,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  pZ = (Struct *)CONCAT44(pZ._4_4_,1);
  if (xPtr.super_shared_ptr_base.pn.pn == (long *)0x0) {
    gtest_ar_26.success_ = false;
    gtest_ar_26._1_7_ = 0;
  }
  else {
    gtest_ar_26._0_8_ = *(undefined8 *)xPtr.super_shared_ptr_base.pn.pn;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&zPtr,"1","xPtr.use_count()",(int *)&pZ,(long *)&gtest_ar_26);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x141,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  gtest_ar_26.success_ = false;
  gtest_ar_26._1_7_ = 0;
  pZ = xPtr.px;
  testing::internal::CmpHelperNE<void*,Struct*>
            ((internal *)&zPtr,"(void*)__null","xPtr.get()",(void **)&gtest_ar_26,&pZ);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x142,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  gtest_ar_26._0_4_ = 0x7b;
  pSVar2 = shared_ptr<Struct>::operator->(&xPtr);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&zPtr,"123","xPtr->mVal",(int *)&gtest_ar_26,&pSVar2->mVal);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x143,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  gtest_ar_26._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&zPtr,"2","Struct::_mNbInstances",(int *)&gtest_ar_26,
             &Struct::_mNbInstances);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x144,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  gtest_ar_26.success_ = true;
  testing::internal::CmpHelperEQ<bool,shared_ptr<Struct>>
            ((internal *)&zPtr,"true","yPtr",&gtest_ar_26.success_,&yPtr);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x146,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  gtest_ar_26.success_ = true;
  if ((long *)CONCAT71(yPtr.super_shared_ptr_base.pn.pn._1_7_,(char)yPtr.super_shared_ptr_base.pn.pn
                      ) == (long *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = *(long *)CONCAT71(yPtr.super_shared_ptr_base.pn.pn._1_7_,
                              (char)yPtr.super_shared_ptr_base.pn.pn) == 1;
  }
  pZ = (Struct *)CONCAT71(pZ._1_7_,bVar4);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&zPtr,"true","yPtr.unique()",&gtest_ar_26.success_,(bool *)&pZ);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x147,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  pZ = (Struct *)CONCAT44(pZ._4_4_,1);
  if ((undefined8 *)
      CONCAT71(yPtr.super_shared_ptr_base.pn.pn._1_7_,(char)yPtr.super_shared_ptr_base.pn.pn) ==
      (undefined8 *)0x0) {
    gtest_ar_26.success_ = false;
    gtest_ar_26._1_7_ = 0;
  }
  else {
    gtest_ar_26._0_8_ =
         *(undefined8 *)
          CONCAT71(yPtr.super_shared_ptr_base.pn.pn._1_7_,(char)yPtr.super_shared_ptr_base.pn.pn);
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&zPtr,"1","yPtr.use_count()",(int *)&pZ,(long *)&gtest_ar_26);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x148,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  gtest_ar_26.success_ = false;
  gtest_ar_26._1_7_ = 0;
  pZ = yPtr.px;
  testing::internal::CmpHelperNE<void*,Struct*>
            ((internal *)&zPtr,"(void*)__null","yPtr.get()",(void **)&gtest_ar_26,&pZ);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x149,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  gtest_ar_26._0_4_ = 0xea;
  pSVar2 = shared_ptr<Struct>::operator->(&yPtr);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&zPtr,"234","yPtr->mVal",(int *)&gtest_ar_26,&pSVar2->mVal);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x14a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  testing::internal::CmpHelperNE<shared_ptr<Struct>,shared_ptr<Struct>>
            ((internal *)&zPtr,"xPtr","yPtr",&xPtr,&yPtr);
  if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x14d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_26);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  if (pX < yPtr.px) {
    testing::internal::CmpHelperLT<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)&zPtr,"xPtr","yPtr",&xPtr,&yPtr);
    if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&gtest_ar_26);
      if (zPtr.px == (Struct *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)zPtr.px;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&pZ,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x150,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_26);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&zPtr.px);
    testing::internal::CmpHelperLE<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)&zPtr,"xPtr","yPtr",&xPtr,&yPtr);
    if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&gtest_ar_26);
      if (zPtr.px == (Struct *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)zPtr.px;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&pZ,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x151,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_26);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&zPtr.px);
    testing::internal::CmpHelperGT<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)&zPtr,"yPtr","xPtr",&yPtr,&xPtr);
    if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&gtest_ar_26);
      if (zPtr.px == (Struct *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)zPtr.px;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&pZ,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x152,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_26);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&zPtr.px);
    testing::internal::CmpHelperGE<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)&zPtr,"yPtr","xPtr",&yPtr,&xPtr);
    if ((char)zPtr.super_shared_ptr_base.pn.pn != '\0') goto LAB_001323fe;
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x153,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
  }
  else {
    testing::internal::CmpHelperGT<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)&zPtr,"xPtr","yPtr",&xPtr,&yPtr);
    if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&gtest_ar_26);
      if (zPtr.px == (Struct *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)zPtr.px;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&pZ,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x157,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_26);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&zPtr.px);
    testing::internal::CmpHelperGE<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)&zPtr,"xPtr","yPtr",&xPtr,&yPtr);
    if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&gtest_ar_26);
      if (zPtr.px == (Struct *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)zPtr.px;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&pZ,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x158,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_26);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&zPtr.px);
    testing::internal::CmpHelperLT<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)&zPtr,"yPtr","xPtr",&yPtr,&xPtr);
    if ((char)zPtr.super_shared_ptr_base.pn.pn == '\0') {
      testing::Message::Message((Message *)&gtest_ar_26);
      if (zPtr.px == (Struct *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)zPtr.px;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&pZ,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x159,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_26);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&zPtr.px);
    testing::internal::CmpHelperLE<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)&zPtr,"yPtr","xPtr",&yPtr,&xPtr);
    if ((char)zPtr.super_shared_ptr_base.pn.pn != '\0') goto LAB_001323fe;
    testing::Message::Message((Message *)&gtest_ar_26);
    if (zPtr.px == (Struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)zPtr.px;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pZ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x15a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pZ,(Message *)&gtest_ar_26);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pZ);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_26);
LAB_001323fe:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&zPtr.px);
  shared_ptr<Struct>::shared_ptr(&zPtr,&xPtr);
  pZ = zPtr.px;
  testing::internal::CmpHelperEQ<Struct*,Struct*>((internal *)&gtest_ar_26,"pX","pZ",&pX,&pZ);
  if (gtest_ar_26.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar_26.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_26.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x161,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_26.message_);
  testing::internal::CmpHelperEQ<shared_ptr<Struct>,shared_ptr<Struct>>
            ((internal *)&gtest_ar_26,"xPtr","zPtr",&xPtr,&zPtr);
  if (gtest_ar_26.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar_26.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_26.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x162,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_26.message_);
  testing::internal::CmpHelperEQ<shared_ptr<Struct>,shared_ptr<Struct>>
            ((internal *)&gtest_ar_26,"zPtr","xPtr",&zPtr,&xPtr);
  if (gtest_ar_26.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar_26.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_26.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x163,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_26.message_);
  testing::internal::CmpHelperGE<shared_ptr<Struct>,shared_ptr<Struct>>
            ((internal *)&gtest_ar_26,"xPtr","zPtr",&xPtr,&zPtr);
  if (gtest_ar_26.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar_26.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_26.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x164,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_26.message_);
  testing::internal::CmpHelperLE<shared_ptr<Struct>,shared_ptr<Struct>>
            ((internal *)&gtest_ar_26,"xPtr","zPtr",&xPtr,&zPtr);
  if (gtest_ar_26.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar_26.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_26.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x165,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_26.message_);
  shared_ptr<Struct>::release(&zPtr);
  shared_ptr<Struct>::release(&yPtr);
  shared_ptr<Struct>::release(&xPtr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(shared_ptr, compare_ptr)
{
    // Create a shared_ptr
    shared_ptr<Struct> xPtr(new Struct(123));

    EXPECT_EQ(true, xPtr);
    EXPECT_EQ(true, xPtr.unique());
    EXPECT_EQ(1, xPtr.use_count());
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(1, Struct::_mNbInstances);
    Struct* pX = xPtr.get();

    // Create another shared_ptr
    shared_ptr<Struct> yPtr(new Struct(234));

    EXPECT_EQ(true, xPtr);
    EXPECT_EQ(true, xPtr.unique());
    EXPECT_EQ(1, xPtr.use_count());
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(2, Struct::_mNbInstances);

    EXPECT_EQ(true, yPtr);
    EXPECT_EQ(true, yPtr.unique());
    EXPECT_EQ(1, yPtr.use_count());
    EXPECT_NE((void*)NULL, yPtr.get());
    EXPECT_EQ(234, yPtr->mVal);
    Struct* pY = yPtr.get();

    EXPECT_NE(xPtr, yPtr);
    if (pX < pY)
    {
        EXPECT_LT(xPtr, yPtr);
        EXPECT_LE(xPtr, yPtr);
        EXPECT_GT(yPtr, xPtr);
        EXPECT_GE(yPtr, xPtr);
    }
    else // (pX > pY)
    {
        EXPECT_GT(xPtr, yPtr);
        EXPECT_GE(xPtr, yPtr);
        EXPECT_LT(yPtr, xPtr);
        EXPECT_LE(yPtr, xPtr);
    }

    // Copy a shared_ptr
    shared_ptr<Struct> zPtr = xPtr;
    Struct* pZ = zPtr.get();

    EXPECT_EQ(pX, pZ);
    EXPECT_EQ(xPtr, zPtr);
    EXPECT_EQ(zPtr, xPtr);
    EXPECT_GE(xPtr, zPtr);
    EXPECT_LE(xPtr, zPtr);
}